

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void make_engr_at(level *lev,int x,int y,char *s,long e_time,xchar e_type)

{
  int iVar1;
  engr *peVar2;
  xchar local_44;
  size_t local_40;
  size_t engr_len;
  engr *ep;
  xchar e_type_local;
  long e_time_local;
  char *s_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    local_40 = strlen(s);
    if (0xff < local_40) {
      local_40 = 0xff;
    }
    peVar2 = engr_at(lev,(xchar)x,(xchar)y);
    if (peVar2 != (engr *)0x0) {
      del_engr(lev,peVar2);
    }
    peVar2 = (engr *)malloc((ulong)((int)local_40 + 1) + 0x28);
    memset(peVar2,0,local_40 + 0x29);
    peVar2->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar2;
    peVar2->engr_x = (xchar)x;
    peVar2->engr_y = (xchar)y;
    peVar2->engr_txt = (char *)(peVar2 + 1);
    strncpy(peVar2->engr_txt,s,local_40);
    peVar2->engr_txt[local_40] = '\0';
    while (*peVar2->engr_txt == ' ') {
      peVar2->engr_txt = peVar2->engr_txt + 1;
    }
    if ((in_mklev == '\0') && (iVar1 = strcmp(s,"Elbereth"), iVar1 == 0)) {
      exercise(2,'\x01');
    }
    peVar2->engr_time = e_time;
    local_44 = e_type;
    if (e_type < '\x01') {
      iVar1 = rnd(5);
      local_44 = (xchar)iVar1;
    }
    peVar2->engr_type = local_44;
    peVar2->engr_lth = (int)local_40 + 1;
  }
  return;
}

Assistant:

void make_engr_at(struct level *lev, int x, int y,
		  const char *s, long e_time, xchar e_type)
{
	struct engr *ep;
	size_t engr_len;

	if (!s || !*s)
	    return;

	engr_len = strlen(s);
	if (engr_len > BUFSZ - 1)
	    engr_len = BUFSZ - 1;

	if ((ep = engr_at(lev, x,y)) != 0)
	    del_engr(lev, ep);
	ep = newengr(engr_len + 1);
	memset(ep, 0, sizeof(struct engr) + engr_len + 1);
	ep->nxt_engr = lev->lev_engr;
	lev->lev_engr = ep;
	ep->engr_x = x;
	ep->engr_y = y;
	ep->engr_txt = (char *)(ep + 1);
	strncpy(ep->engr_txt, s, engr_len);
	ep->engr_txt[engr_len] = '\0';
	while (ep->engr_txt[0] == ' ')
	    ep->engr_txt++;
	/* engraving Elbereth shows wisdom */
	if (!in_mklev && !strcmp(s, "Elbereth")) exercise(A_WIS, TRUE);
	ep->engr_time = e_time;
	ep->engr_type = e_type > 0 ? e_type : rnd(N_ENGRAVE-1);
	ep->engr_lth = engr_len + 1;
}